

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall
WriterTest_WriteLongDouble_Test::~WriterTest_WriteLongDouble_Test
          (WriterTest_WriteLongDouble_Test *this)

{
  void *in_RDI;
  
  ~WriterTest_WriteLongDouble_Test((WriterTest_WriteLongDouble_Test *)0x19f118);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(WriterTest, WriteLongDouble) {
  CHECK_WRITE(4.2l);
  CHECK_WRITE_CHAR(-4.2l);
  std::wstring str;
  std_format(4.2l, str);
  if (str[0] != '-')
    CHECK_WRITE_WCHAR(-4.2l);
  else
    fmt::print("warning: long double formatting with std::swprintf is broken");
  CHECK_WRITE(std::numeric_limits<long double>::min());
  CHECK_WRITE(std::numeric_limits<long double>::max());
}